

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_RedefString(char *symName,char *value)

{
  bool bVar1;
  Symbol *sym;
  char *value_local;
  char *symName_local;
  
  symName_local = sym_FindExactSymbol(symName)->name;
  if ((Symbol *)symName_local == (Symbol *)0x0) {
    symName_local = sym_AddString(symName,value)->name;
  }
  else if (((Symbol *)symName_local)->type == SYM_EQUS) {
    if ((((Symbol *)symName_local)->isBuiltin & 1U) == 0) {
      updateSymbolFilename((Symbol *)symName_local);
      assignStringSymbol((Symbol *)symName_local,value);
    }
    else {
      error("Built-in symbol \'%s\' cannot be redefined\n",symName);
      symName_local = (char *)0x0;
    }
  }
  else {
    bVar1 = sym_IsDefined((Symbol *)symName_local);
    if (bVar1) {
      error("\'%s\' already defined as non-EQUS at ",symName);
    }
    else {
      error("\'%s\' already referenced at ",symName);
    }
    dumpFilename((Symbol *)symName_local);
    putc(10,_stderr);
    symName_local = (char *)0x0;
  }
  return (Symbol *)symName_local;
}

Assistant:

struct Symbol *sym_RedefString(char const *symName, char const *value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym)
		return sym_AddString(symName, value);

	if (sym->type != SYM_EQUS) {
		if (sym_IsDefined(sym))
			error("'%s' already defined as non-EQUS at ", symName);
		else
			error("'%s' already referenced at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be redefined\n", symName);
		return NULL;
	}

	updateSymbolFilename(sym);
	// FIXME: this leaks the previous sym->macro value, but this can't
	// free(sym->macro) because the expansion may be redefining itself.
	assignStringSymbol(sym, value);

	return sym;
}